

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  long *plVar1;
  undefined8 uVar2;
  pointer pSVar3;
  deUint32 dVar4;
  void *pvVar5;
  long *plVar6;
  int *piVar7;
  ThreadGroupThread *this_00;
  uint uVar8;
  allocator_type *__a;
  size_type __n;
  long lVar9;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  resources;
  ThreadGroup threads;
  Environment env;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_d8;
  long local_c8;
  Context *local_c0;
  VkQueryType local_b8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  local_b0;
  ThreadGroup local_98;
  _func_int *local_68;
  DeviceInterface *local_60;
  VkDevice local_58;
  deUint32 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_b8 = params.queryType;
  local_c0 = context;
  dVar4 = deGetNumAvailableLogicalCores();
  uVar8 = 8;
  if (dVar4 < 8) {
    uVar8 = dVar4;
  }
  __n = 2;
  if (2 < uVar8) {
    __n = (size_type)uVar8;
  }
  local_68 = *(_func_int **)(this + 8);
  local_60 = Context::getDeviceInterface((Context *)this);
  local_58 = Context::getDevice((Context *)this);
  local_50 = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_48 = *(undefined8 *)(this + 0x10);
  local_40 = 0;
  local_38 = 1;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::vector(&local_b0,__n,__a);
  ThreadGroup::ThreadGroup(&local_98);
  local_c8 = __n << 4;
  lVar9 = 0;
  do {
    pvVar5 = operator_new(1);
    plVar6 = (long *)operator_new(0x20);
    pSVar3 = local_b0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d23e10;
    plVar6[2] = (long)pvVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar1 = *(long **)((long)&(local_b0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar9);
    if (plVar1 != plVar6) {
      if (plVar1 != (long *)0x0) {
        LOCK();
        plVar1 = plVar1 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          *(undefined8 *)
           ((long)&(local_b0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9) = 0;
          (**(code **)(**(long **)((long)&(local_b0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar9) + 0x10))();
        }
        LOCK();
        piVar7 = (int *)(*(long *)((long)&pSVar3->m_state + lVar9) + 0xc);
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          plVar1 = *(long **)((long)&pSVar3->m_state + lVar9);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          *(undefined8 *)((long)&pSVar3->m_state + lVar9) = 0;
        }
      }
      *(void **)((long)&pSVar3->m_ptr + lVar9) = pvVar5;
      *(long **)((long)&pSVar3->m_state + lVar9) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      piVar7 = (int *)(*(long *)((long)&pSVar3->m_state + lVar9) + 0xc);
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    plVar1 = plVar6 + 1;
    LOCK();
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    piVar7 = (int *)((long)plVar6 + 0xc);
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    this_00 = (ThreadGroupThread *)operator_new(0x88);
    uVar2 = *(undefined8 *)
             ((long)&(local_b0.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9);
    ThreadGroupThread::ThreadGroupThread(this_00);
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d23e50;
    this_00[1].super_Thread._vptr_Thread = &local_68;
    *(undefined8 *)&this_00[1].super_Thread.m_attribs = uVar2;
    this_00[1].super_Thread.m_thread = (deThread)&local_c0;
    local_d8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_00;
    ThreadGroup::add(&local_98,&local_d8);
    if (local_d8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_d8.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_d8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar9 = lVar9 + 0x10;
  } while (local_c8 != lVar9);
  ThreadGroup::run(__return_storage_ptr__,&local_98);
  de::SpinBarrier::~SpinBarrier(&local_98.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_98.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::~vector(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}